

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

void __thiscall svg::Text::~Text(Text *this)

{
  Text *in_RDI;
  
  ~Text(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Text(Point const & origin, std::string const & content, Fill const & fill = Fill(),
             Font const & font = Font(), Stroke const & stroke = Stroke())
            : Shape(fill, stroke), origin(origin), content(content), font(font) { }